

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O1

int mdb_pages_xkeep(MDB_cursor *mc,uint pflags,int all)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  MDB_txn *pMVar4;
  MDB_xcursor *pMVar5;
  pgno_t pgno;
  byte bVar6;
  MDB_xcursor *pMVar7;
  int iVar8;
  ulong uVar9;
  MDB_xcursor *pMVar10;
  long lVar11;
  MDB_cursor *pMVar12;
  bool bVar13;
  int level;
  MDB_page *dp;
  int local_3c;
  MDB_page *local_38;
  
  pMVar4 = mc->mc_txn;
  pMVar10 = (MDB_xcursor *)0x0;
  if ((mc->mc_flags & 0x40) == 0) {
    pMVar10 = (MDB_xcursor *)mc;
  }
  uVar9 = (ulong)pMVar4->mt_numdbs;
LAB_0010cadf:
  for (; pMVar10 != (MDB_xcursor *)0x0; pMVar10 = *(MDB_xcursor **)&pMVar10->mx_cursor) {
    bVar6 = *(byte *)((long)&pMVar10->mx_cursor + 0x44) & 1;
    pMVar7 = pMVar10;
    while (bVar6 != 0) {
      uVar2 = *(unsigned_short *)((long)&pMVar7->mx_cursor + 0x40);
      if ((ulong)uVar2 == 0) {
        lVar11 = 0xffffffff;
        pMVar12 = (MDB_cursor *)0x0;
      }
      else {
        lVar11 = -1;
        do {
          pMVar12 = *(MDB_cursor **)((long)&pMVar7->mx_cursor + (lVar11 + 10) * 8);
          uVar3 = *(ushort *)((long)&pMVar12->mc_backup + 2);
          if ((uVar3 & 0xc050) == pflags) {
            *(ushort *)((long)&pMVar12->mc_backup + 2) = uVar3 ^ 0x8000;
          }
          lVar1 = lVar11 - (ulong)uVar2;
          lVar11 = lVar11 + 1;
        } while (lVar1 != -2);
      }
      pMVar5 = *(MDB_xcursor **)((long)&pMVar7->mx_cursor + 0x10);
      if ((((pMVar5 == (MDB_xcursor *)0x0) || (pMVar12 == (MDB_cursor *)0x0)) ||
          (((pMVar5->mx_cursor).mc_flags & 1) == 0)) || (((ulong)pMVar12->mc_backup & 0x20000) == 0)
         ) break;
      bVar6 = *(byte *)((long)pMVar12->mc_pg +
                       ((ulong)*(ushort *)
                                ((long)pMVar12->mc_pg +
                                (ulong)(pMVar7->mx_cursor).mc_ki[lVar11] * 2 + -0x38) - 0x44)) & 2;
      pMVar7 = pMVar5;
    }
  }
  bVar13 = uVar9 != 0;
  uVar9 = uVar9 - 1;
  if (bVar13) {
    pMVar10 = (MDB_xcursor *)pMVar4->mt_cursors[uVar9];
    goto LAB_0010cadf;
  }
  iVar8 = 0;
  if ((all != 0) && (iVar8 = 0, pMVar4->mt_numdbs != 0)) {
    uVar9 = 0;
    lVar11 = 0x28;
    iVar8 = 0;
    do {
      if ((pMVar4->mt_dbflags[uVar9] & 1) != 0) {
        pgno = *(pgno_t *)((long)&pMVar4->mt_dbs->md_pad + lVar11);
        if (pgno == 0xffffffffffffffff) {
LAB_0010cc21:
          bVar13 = false;
        }
        else {
          iVar8 = mdb_page_get(mc,pgno,&local_38,&local_3c);
          if (iVar8 == 0) {
            iVar8 = 0;
            if ((local_38->mp_flags & 0xc050) == pflags) {
              bVar13 = false;
              if (1 < local_3c) goto LAB_0010cc23;
              local_38->mp_flags = local_38->mp_flags ^ 0x8000;
              iVar8 = 0;
            }
            goto LAB_0010cc21;
          }
          bVar13 = true;
        }
LAB_0010cc23:
        if (bVar13) {
          return iVar8;
        }
      }
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 0x30;
    } while (uVar9 < pMVar4->mt_numdbs);
  }
  return iVar8;
}

Assistant:

static int
mdb_pages_xkeep(MDB_cursor *mc, unsigned pflags, int all)
{
	enum { Mask = P_SUBP|P_DIRTY|P_LOOSE|P_KEEP };
	MDB_txn *txn = mc->mc_txn;
	MDB_cursor *m3, *m0 = mc;
	MDB_xcursor *mx;
	MDB_page *dp, *mp;
	MDB_node *leaf;
	unsigned i, j;
	int rc = MDB_SUCCESS, level;

	/* Mark pages seen by cursors */
	if (mc->mc_flags & C_UNTRACK)
		mc = NULL;				/* will find mc in mt_cursors */
	for (i = txn->mt_numdbs;; mc = txn->mt_cursors[--i]) {
		for (; mc; mc=mc->mc_next) {
			if (!(mc->mc_flags & C_INITIALIZED))
				continue;
			for (m3 = mc;; m3 = &mx->mx_cursor) {
				mp = NULL;
				for (j=0; j<m3->mc_snum; j++) {
					mp = m3->mc_pg[j];
					if ((mp->mp_flags & Mask) == pflags)
						mp->mp_flags ^= P_KEEP;
				}
				mx = m3->mc_xcursor;
				/* Proceed to mx if it is at a sub-database */
				if (! (mx && (mx->mx_cursor.mc_flags & C_INITIALIZED)))
					break;
				if (! (mp && (mp->mp_flags & P_LEAF)))
					break;
				leaf = NODEPTR(mp, m3->mc_ki[j-1]);
				if (!(leaf->mn_flags & F_SUBDATA))
					break;
			}
		}
		if (i == 0)
			break;
	}

	if (all) {
		/* Mark dirty root pages */
		for (i=0; i<txn->mt_numdbs; i++) {
			if (txn->mt_dbflags[i] & DB_DIRTY) {
				pgno_t pgno = txn->mt_dbs[i].md_root;
				if (pgno == P_INVALID)
					continue;
				if ((rc = mdb_page_get(m0, pgno, &dp, &level)) != MDB_SUCCESS)
					break;
				if ((dp->mp_flags & Mask) == pflags && level <= 1)
					dp->mp_flags ^= P_KEEP;
			}
		}
	}

	return rc;
}